

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

void upb_Message_ClearOneof(upb_Message *msg,upb_MiniTable *m,upb_MiniTableField *f)

{
  uint32_t number;
  upb_MiniTableField *f_00;
  
  if (((ulong)msg->field_0 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x382,
                  "void upb_Message_ClearOneof(struct upb_Message *, const upb_MiniTable *, const upb_MiniTableField *)"
                 );
  }
  number = upb_Message_WhichOneofFieldNumber(msg,f);
  if (number != 0) {
    f_00 = upb_MiniTable_FindFieldByNumber(m,number);
    upb_Message_ClearBaseField(msg,f_00);
    return;
  }
  return;
}

Assistant:

UPB_API_INLINE void upb_Message_ClearOneof(struct upb_Message* msg,
                                           const upb_MiniTable* m,
                                           const upb_MiniTableField* f) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  uint32_t field_number = upb_Message_WhichOneofFieldNumber(msg, f);
  if (field_number == 0) {
    // No field in the oneof is set.
    return;
  }

  const upb_MiniTableField* field =
      upb_MiniTable_FindFieldByNumber(m, field_number);
  upb_Message_ClearBaseField(msg, field);
}